

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.hpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLReader::setXMLVersion(XMLReader *this,XMLVersion version)

{
  XMLVersion version_local;
  XMLReader *this_local;
  
  this->fXMLVersion = version;
  if (version == XMLV1_1) {
    this->fNEL = true;
    this->fgCharCharsTable = &XMLChar1_1::fgCharCharsTable1_1;
  }
  else {
    this->fNEL = (bool)(XMLChar1_0::enableNEL & 1);
    this->fgCharCharsTable = &XMLChar1_0::fgCharCharsTable1_0;
  }
  return;
}

Assistant:

inline void XMLReader::setXMLVersion(const XMLVersion version)
{
    fXMLVersion = version;
    if (version == XMLV1_1) {
        fNEL = true;
        fgCharCharsTable = XMLChar1_1::fgCharCharsTable1_1;
    }
    else {
        fNEL = XMLChar1_0::enableNEL;
        fgCharCharsTable = XMLChar1_0::fgCharCharsTable1_0;
    }

}